

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

Vec_Str_t * Scl_LibertyReadSclStr(Scl_Tree_t *p,int fVerbose,int fVeryVerbose)

{
  ulong uVar1;
  byte bVar2;
  double dVar3;
  Vec_Flt_t *p_00;
  Vec_Flt_t *p_01;
  Vec_Ptr_t *vOut;
  Vec_Ptr_t *vOut_00;
  Vec_Ptr_t *vOut_01;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Vec_Ptr_t *p_02;
  Vec_Str_t *vOut_02;
  char *pcVar11;
  Scl_Item_t *pSVar12;
  Vec_Ptr_t *p_03;
  Scl_Item_t *pSVar13;
  char *Entry;
  Vec_Wrd_t *__ptr;
  Vec_Ptr_t *pVVar14;
  Scl_Item_t *pSVar15;
  Vec_Ptr_t *pVVar16;
  void *__ptr_00;
  Vec_Flt_t *pVVar17;
  abctime aVar18;
  abctime time;
  uint i_00;
  ulong uVar19;
  ulong uVar20;
  int i;
  long lVar21;
  long lVar22;
  uint uVar23;
  int *piVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  uint local_f8;
  int local_e4;
  Vec_Flt_t *vValues;
  Vec_Flt_t *vInd1;
  Vec_Flt_t *vInd0;
  Vec_Ptr_t *vTables [4];
  
  p_02 = Scl_LibertyReadTemplates(p);
  vOut_02 = Vec_StrAlloc(10000);
  Vec_StrPutI_(vOut_02,8);
  pcVar11 = Scl_LibertyReadString(p,p->pItems->Head);
  Vec_StrPutS_(vOut_02,pcVar11);
  pcVar11 = Scl_LibertyReadDefaultWireLoad(p);
  Vec_StrPutS_(vOut_02,pcVar11);
  pcVar11 = Scl_LibertyReadDefaultWireLoadSel(p);
  Vec_StrPutS_(vOut_02,pcVar11);
  fVar25 = Scl_LibertyReadDefaultMaxTrans(p);
  Vec_StrPutF_(vOut_02,fVar25);
  iVar4 = Scl_LibertyReadTimeUnit(p);
  Vec_StrPutI_(vOut_02,iVar4);
  Scl_LibertyReadLoadUnit(p,vOut_02);
  Scl_LibertyReadWireLoad(p,vOut_02);
  Scl_LibertyReadWireLoadSelect(p,vOut_02);
  pSVar12 = Scl_LibertyItem(p,p->pItems->Child);
  local_f8 = 0;
  iVar6 = 0;
  iVar4 = 0;
  local_e4 = 0;
  for (; pSVar12 != (Scl_Item_t *)0x0; pSVar12 = Scl_LibertyItem(p,pSVar12->Next)) {
    iVar5 = Scl_LibertyCompare(p,pSVar12->Key,"cell");
    if (iVar5 == 0) {
      iVar5 = Scl_LibertyReadCellIsFlop(p,pSVar12);
      if (iVar5 == 0) {
        iVar5 = Scl_LibertyReadCellIsDontUse(p,pSVar12);
        if (iVar5 == 0) {
          iVar5 = Scl_LibertyReadCellIsThreeState(p,pSVar12);
          if (iVar5 == 0) {
            iVar5 = Scl_LibertyReadCellOutputNum(p,pSVar12);
            if (iVar5 == 0) {
              if (fVeryVerbose != 0) {
                pcVar11 = Scl_LibertyReadString(p,pSVar12->Head);
                printf("Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n",
                       pcVar11);
              }
              local_e4 = local_e4 + 1;
            }
            else {
              local_f8 = local_f8 + 1;
            }
          }
          else {
            if (fVeryVerbose != 0) {
              pcVar11 = Scl_LibertyReadString(p,pSVar12->Head);
              printf("Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n",pcVar11);
            }
            iVar4 = iVar4 + 1;
          }
        }
        else if (fVeryVerbose != 0) {
          pcVar11 = Scl_LibertyReadString(p,pSVar12->Head);
          printf("Scl_LibertyReadGenlib() skipped cell \"%s\" due to dont_use attribute.\n",pcVar11)
          ;
        }
      }
      else {
        if (fVeryVerbose != 0) {
          pcVar11 = Scl_LibertyReadString(p,pSVar12->Head);
          printf("Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n",pcVar11);
        }
        iVar6 = iVar6 + 1;
      }
    }
  }
  Vec_StrPutI_(vOut_02,local_f8);
  pSVar12 = Scl_LibertyItem(p,p->pItems->Child);
  do {
    if (pSVar12 == (Scl_Item_t *)0x0) {
      if (p_02 != (Vec_Ptr_t *)0x0) {
        uVar23 = p_02->nSize;
        if ((uVar23 & 3) != 0) {
          __assert_fail("Vec_PtrSize(vTemples) % 4 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                        ,0x676,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
        }
        i_00 = 0;
        if ((int)uVar23 < 1) {
          uVar23 = 0;
          i_00 = 0;
        }
        for (; uVar23 != i_00; i_00 = i_00 + 1) {
          pVVar17 = (Vec_Flt_t *)Vec_PtrEntry(p_02,i_00);
          if (pVVar17 != (Vec_Flt_t *)0x0) {
            if ((i_00 & 3) - 2 < 2) {
              Vec_FltFree(pVVar17);
            }
            else if ((i_00 & 3) != 1) {
              free(pVVar17);
            }
          }
        }
        Vec_PtrFree(p_02);
      }
      if (fVerbose != 0) {
        pcVar11 = Scl_LibertyReadString(p,p->pItems->Head);
        printf("Library \"%s\" from \"%s\" has %d cells ",pcVar11,p->pFileName,(ulong)local_f8);
        printf("(%d skipped: %d seq; %d tri-state; %d no func; %d dont_use).  ",
               (ulong)(uint)(iVar4 + iVar6 + local_e4));
        aVar18 = Abc_Clock();
        Abc_PrintTime(0x816bba,(char *)(aVar18 - p->clkStart),time);
      }
      return vOut_02;
    }
    iVar5 = Scl_LibertyCompare(p,pSVar12->Key,"cell");
    if ((((iVar5 == 0) && (iVar5 = Scl_LibertyReadCellIsFlop(p,pSVar12), iVar5 == 0)) &&
        (iVar5 = Scl_LibertyReadCellIsDontUse(p,pSVar12), iVar5 == 0)) &&
       ((iVar5 = Scl_LibertyReadCellIsThreeState(p,pSVar12), iVar5 == 0 &&
        (iVar5 = Scl_LibertyReadCellOutputNum(p,pSVar12), iVar5 != 0)))) {
      pcVar11 = Scl_LibertyReadString(p,pSVar12->Head);
      Vec_StrPutS_(vOut_02,pcVar11);
      pcVar11 = Scl_LibertyReadCellArea(p,pSVar12);
      fVar25 = 1.0;
      if (pcVar11 != (char *)0x0) {
        dVar3 = atof(pcVar11);
        fVar25 = (float)dVar3;
      }
      Vec_StrPutF_(vOut_02,fVar25);
      pcVar11 = Scl_LibertyReadCellLeakage(p,pSVar12);
      if (pcVar11 == (char *)0x0) {
        fVar25 = 0.0;
      }
      else {
        dVar3 = atof(pcVar11);
        fVar25 = (float)dVar3;
      }
      Vec_StrPutF_(vOut_02,fVar25);
      iVar5 = Scl_LibertyReadDeriveStrength(p,pSVar12);
      Vec_StrPutI_(vOut_02,iVar5);
      iVar5 = Scl_LibertyReadCellOutputNum(p,pSVar12);
      iVar7 = Scl_LibertyItemNum(p,pSVar12,"pin");
      Vec_StrPutI_(vOut_02,iVar7 - iVar5);
      Vec_StrPutI_(vOut_02,iVar5);
      p_03 = Vec_PtrAlloc(0x10);
      piVar24 = &pSVar12->Child;
      while (pSVar13 = Scl_LibertyItem(p,*piVar24), pSVar13 != (Scl_Item_t *)0x0) {
        iVar5 = Scl_LibertyCompare(p,pSVar13->Key,"pin");
        if ((iVar5 == 0) && (pcVar11 = Scl_LibertyReadPinFormula(p,pSVar13), pcVar11 == (char *)0x0)
           ) {
          iVar5 = Scl_LibertyReadPinDirection(p,pSVar13);
          if (iVar5 != 0) {
            __assert_fail("Scl_LibertyReadPinDirection(p, pPin) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                          ,0x5f8,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
          }
          pcVar11 = Scl_LibertyReadString(p,pSVar13->Head);
          Entry = Abc_UtilStrsav(pcVar11);
          Vec_PtrPush(p_03,Entry);
          Vec_StrPutS_(vOut_02,pcVar11);
          fVar25 = Scl_LibertyReadPinCap(p,pSVar13,"capacitance");
          fVar26 = Scl_LibertyReadPinCap(p,pSVar13,"rise_capacitance");
          fVar27 = Scl_LibertyReadPinCap(p,pSVar13,"fall_capacitance");
          Vec_StrPutF_(vOut_02,(float)(~-(uint)(fVar26 == 0.0) & (uint)fVar26 |
                                      -(uint)(fVar26 == 0.0) & (uint)fVar25));
          Vec_StrPutF_(vOut_02,(float)(~-(uint)(fVar27 == 0.0) & (uint)fVar27 |
                                      (uint)fVar25 & -(uint)(fVar27 == 0.0)));
        }
        piVar24 = &pSVar13->Next;
      }
      for (pSVar13 = Scl_LibertyItem(p,pSVar12->Child); pSVar13 != (Scl_Item_t *)0x0;
          pSVar13 = Scl_LibertyItem(p,pSVar13->Next)) {
        iVar5 = Scl_LibertyCompare(p,pSVar13->Key,"pin");
        if ((iVar5 == 0) && (pcVar11 = Scl_LibertyReadPinFormula(p,pSVar13), pcVar11 != (char *)0x0)
           ) {
          iVar5 = Scl_LibertyReadPinDirection(p,pSVar13);
          if (iVar5 != 1) {
            __assert_fail("Scl_LibertyReadPinDirection(p, pPin) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                          ,0x60d,"Vec_Str_t *Scl_LibertyReadSclStr(Scl_Tree_t *, int, int)");
          }
          pcVar11 = Scl_LibertyReadString(p,pSVar13->Head);
          Vec_StrPutS_(vOut_02,pcVar11);
          fVar25 = Scl_LibertyReadPinCap(p,pSVar13,"max_capacitance");
          Vec_StrPutF_(vOut_02,fVar25);
          fVar25 = Scl_LibertyReadPinCap(p,pSVar13,"max_transition");
          Vec_StrPutF_(vOut_02,fVar25);
          iVar5 = p_03->nSize;
          Vec_StrPutI_(vOut_02,iVar5);
          pcVar11 = Scl_LibertyReadPinFormula(p,pSVar13);
          Vec_StrPutS_(vOut_02,pcVar11);
          __ptr = Mio_ParseFormulaTruth(pcVar11,(char **)p_03->pArray,iVar5);
          if (__ptr == (Vec_Wrd_t *)0x0) {
            return (Vec_Str_t *)0x0;
          }
          bVar2 = (char)iVar5 - 6U & 0x1f;
          uVar23 = 1 << bVar2;
          if (1 << bVar2 < 1) {
            uVar23 = 0;
          }
          uVar20 = (ulong)uVar23;
          if (iVar5 < 7) {
            uVar20 = 1;
          }
          for (uVar19 = 0; uVar19 != uVar20; uVar19 = uVar19 + 1) {
            if ((long)__ptr->nSize <= (long)uVar19) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
            }
            uVar1 = __ptr->pArray[uVar19];
            for (lVar21 = 0; lVar21 != 0x40; lVar21 = lVar21 + 8) {
              Vec_StrPush(vOut_02,(char)(uVar1 >> ((byte)lVar21 & 0x3f)));
            }
          }
          free(__ptr->pArray);
          free(__ptr);
          iVar7 = 0;
          if (iVar5 < 1) {
            iVar5 = iVar7;
          }
          for (; iVar7 != iVar5; iVar7 = iVar7 + 1) {
            pcVar11 = (char *)Vec_PtrEntry(p_03,iVar7);
            pVVar14 = Scl_LibertyReadPinTimingAll(p,pSVar13,pcVar11);
            Vec_StrPutS_(vOut_02,pcVar11);
            iVar9 = pVVar14->nSize;
            Vec_StrPutI_(vOut_02,(uint)(iVar9 != 0));
            if (iVar9 == 0) {
              Vec_PtrFree(pVVar14);
            }
            else {
              pSVar15 = (Scl_Item_t *)Vec_PtrEntry(pVVar14,0);
              iVar8 = Scl_LibertyReadTimingSense(p,pSVar15);
              Vec_StrPutI_(vOut_02,iVar8);
              for (lVar21 = 0; vOut_01 = vTables[3], vOut_00 = vTables[2], vOut = vTables[1],
                  pVVar16 = vTables[0], lVar21 != 4; lVar21 = lVar21 + 1) {
                pVVar16 = Vec_PtrAlloc(0x10);
                vTables[lVar21] = pVVar16;
              }
              iVar8 = 0;
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              for (; iVar9 != iVar8; iVar8 = iVar8 + 1) {
                pSVar15 = (Scl_Item_t *)Vec_PtrEntry(pVVar14,iVar8);
                iVar10 = Scl_LibertyScanTable(p,pVVar16,pSVar15,"cell_rise",p_02);
                if (((((iVar10 == 0) &&
                      (iVar10 = Scl_LibertyScanTable(p,pVVar16,pSVar15,"cell_fall",p_02),
                      iVar10 == 0)) ||
                     ((iVar10 = Scl_LibertyScanTable(p,vOut,pSVar15,"cell_fall",p_02), iVar10 == 0
                      && (iVar10 = Scl_LibertyScanTable(p,vOut,pSVar15,"cell_rise",p_02),
                         iVar10 == 0)))) ||
                    ((iVar10 = Scl_LibertyScanTable(p,vOut_00,pSVar15,"rise_transition",p_02),
                     iVar10 == 0 &&
                     (iVar10 = Scl_LibertyScanTable(p,vOut_00,pSVar15,"fall_transition",p_02),
                     iVar10 == 0)))) ||
                   ((iVar10 = Scl_LibertyScanTable(p,vOut_01,pSVar15,"fall_transition",p_02),
                    iVar10 == 0 &&
                    (iVar10 = Scl_LibertyScanTable(p,vOut_01,pSVar15,"rise_transition",p_02),
                    iVar10 == 0)))) {
                  puts("Table cannot be found");
                  return (Vec_Str_t *)0x0;
                }
              }
              Vec_PtrFree(pVVar14);
              for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
                pVVar14 = vTables[lVar21];
                Scl_LibertyComputeWorstCase(pVVar14,&vInd0,&vInd1,&vValues);
                for (lVar22 = 0; lVar22 < pVVar14->nSize; lVar22 = lVar22 + 1) {
                  if ((Vec_Ptr_t *)pVVar14->pArray[lVar22] != (Vec_Ptr_t *)0x0) {
                    Vec_PtrFree((Vec_Ptr_t *)pVVar14->pArray[lVar22]);
                  }
                }
                Vec_PtrFree(pVVar14);
                p_01 = vInd0;
                p_00 = vInd1;
                pVVar17 = vValues;
                Scl_LibertyDumpTables(vOut_02,vInd0,vInd1,vValues);
                Vec_FltFree(p_01);
                Vec_FltFree(p_00);
                Vec_FltFree(pVVar17);
              }
            }
          }
        }
      }
      if (p_03 != (Vec_Ptr_t *)0x0) {
        iVar5 = p_03->nSize;
        iVar7 = 0;
        if (iVar5 < 1) {
          iVar5 = 0;
          iVar7 = 0;
        }
        for (; iVar5 != iVar7; iVar7 = iVar7 + 1) {
          __ptr_00 = Vec_PtrEntry(p_03,iVar7);
          if ((void *)0x2 < __ptr_00) {
            free(__ptr_00);
          }
        }
        Vec_PtrFree(p_03);
      }
    }
    pSVar12 = Scl_LibertyItem(p,pSVar12->Next);
  } while( true );
}

Assistant:

Vec_Str_t * Scl_LibertyReadSclStr( Scl_Tree_t * p, int fVerbose, int fVeryVerbose )
{
    int fUseFirstTable = 0;
    Vec_Str_t * vOut;
    Vec_Ptr_t * vNameIns, * vTemples = NULL;
    Scl_Item_t * pCell, * pPin, * pTiming;
    Vec_Wrd_t * vTruth;
    char * pFormula, * pName;
    int i, k, Counter, nOutputs, nCells;
    int nSkipped[4] = {0};

    // read delay-table templates
    vTemples = Scl_LibertyReadTemplates( p );

    // start the library
    vOut = Vec_StrAlloc( 10000 );
    Vec_StrPutI_( vOut, ABC_SCL_CUR_VERSION );

    // top level information
    Vec_StrPut_( vOut );
    Vec_StrPutS_( vOut, Scl_LibertyReadString(p, Scl_LibertyRoot(p)->Head) );
    Vec_StrPutS_( vOut, Scl_LibertyReadDefaultWireLoad(p) );
    Vec_StrPutS_( vOut, Scl_LibertyReadDefaultWireLoadSel(p) );
    Vec_StrPutF_( vOut, Scl_LibertyReadDefaultMaxTrans(p) );
    Vec_StrPutI_( vOut, Scl_LibertyReadTimeUnit(p) );
    Scl_LibertyReadLoadUnit( p, vOut );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );

    // read wire loads
    Scl_LibertyReadWireLoad( p, vOut );
    Scl_LibertyReadWireLoadSelect( p, vOut );

    // count cells
    nCells = 0;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pCell, "cell" )
    {
        if ( Scl_LibertyReadCellIsFlop(p, pCell) )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[0]++;
            continue;
        }
        if ( Scl_LibertyReadCellIsDontUse(p, pCell) )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" due to dont_use attribute.\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[3]++;
            continue;
        }
        if ( Scl_LibertyReadCellIsThreeState(p, pCell) )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[1]++;
            continue;
        }
        if ( (Counter = Scl_LibertyReadCellOutputNum(p, pCell)) == 0 )
        {
            if ( fVeryVerbose )  printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n", Scl_LibertyReadString(p, pCell->Head) );
            nSkipped[2]++;
            continue;
        }
        nCells++;
    }
    // read cells
    Vec_StrPutI_( vOut, nCells );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pCell, "cell" )
    {
        if ( Scl_LibertyReadCellIsFlop(p, pCell) )
            continue;
        if ( Scl_LibertyReadCellIsDontUse(p, pCell) )
            continue;
        if ( Scl_LibertyReadCellIsThreeState(p, pCell) )
            continue;
        if ( (Counter = Scl_LibertyReadCellOutputNum(p, pCell)) == 0 )
            continue;
        // top level information
        Vec_StrPutS_( vOut, Scl_LibertyReadString(p, pCell->Head) );
        pName = Scl_LibertyReadCellArea(p, pCell);
        Vec_StrPutF_( vOut, pName ? atof(pName) : 1 );
        pName = Scl_LibertyReadCellLeakage(p, pCell);
        Vec_StrPutF_( vOut, pName ? atof(pName) : 0 );
        Vec_StrPutI_( vOut, Scl_LibertyReadDeriveStrength(p, pCell) );
        // pin count
        nOutputs = Scl_LibertyReadCellOutputNum( p, pCell );
        Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, pCell, "pin") - nOutputs );
        Vec_StrPutI_( vOut, nOutputs );
        Vec_StrPut_( vOut );
        Vec_StrPut_( vOut );

        // input pins
        vNameIns = Vec_PtrAlloc( 16 );
        Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        {
            float CapOne, CapRise, CapFall;
            if ( Scl_LibertyReadPinFormula(p, pPin) != NULL ) // skip output pin
                continue;
            assert( Scl_LibertyReadPinDirection(p, pPin) == 0 );
            pName = Scl_LibertyReadString(p, pPin->Head);
            Vec_PtrPush( vNameIns, Abc_UtilStrsav(pName) );
            Vec_StrPutS_( vOut, pName );
            CapOne  = Scl_LibertyReadPinCap( p, pPin, "capacitance" );
            CapRise = Scl_LibertyReadPinCap( p, pPin, "rise_capacitance" );
            CapFall = Scl_LibertyReadPinCap( p, pPin, "fall_capacitance" );
            if ( CapRise == 0 )
                CapRise = CapOne;
            if ( CapFall == 0 )
                CapFall = CapOne;
            Vec_StrPutF_( vOut, CapRise );
            Vec_StrPutF_( vOut, CapFall );
            Vec_StrPut_( vOut );
        }
        Vec_StrPut_( vOut );
        // output pins
        Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        {
            if ( !Scl_LibertyReadPinFormula(p, pPin) ) // skip input pin
                continue;
            assert( Scl_LibertyReadPinDirection(p, pPin) == 1 );
            pName = Scl_LibertyReadString(p, pPin->Head);
            Vec_StrPutS_( vOut, pName );
            Vec_StrPutF_( vOut, Scl_LibertyReadPinCap( p, pPin, "max_capacitance" ) );
            Vec_StrPutF_( vOut, Scl_LibertyReadPinCap( p, pPin, "max_transition" ) );
            Vec_StrPutI_( vOut, Vec_PtrSize(vNameIns) );
            pFormula = Scl_LibertyReadPinFormula(p, pPin);
            Vec_StrPutS_( vOut, pFormula );
            // write truth table
            vTruth = Mio_ParseFormulaTruth( pFormula, (char **)Vec_PtrArray(vNameIns), Vec_PtrSize(vNameIns) );
            if ( vTruth == NULL )
                return NULL;
            for ( i = 0; i < Abc_Truth6WordNum(Vec_PtrSize(vNameIns)); i++ )
                Vec_StrPutW_( vOut, Vec_WrdEntry(vTruth, i) );
            Vec_WrdFree( vTruth );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );

            // write the delay tables
            if ( fUseFirstTable )
            {
                Vec_PtrForEachEntry( char *, vNameIns, pName, i )
                {
                    pTiming = Scl_LibertyReadPinTiming( p, pPin, pName );
                    Vec_StrPutS_( vOut, pName );
                    Vec_StrPutI_( vOut, (int)(pTiming != NULL) );
                    if ( pTiming == NULL ) // output does not depend on input
                        continue;
                    Vec_StrPutI_( vOut, Scl_LibertyReadTimingSense(p, pTiming) );
                    Vec_StrPut_( vOut );
                    Vec_StrPut_( vOut );
                    // some cells only have 'rise' or 'fall' but not both - here we work around this
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_rise",           vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_fall",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_fall",           vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "cell_rise",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "rise_transition",     vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "fall_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyReadTable( p, vOut, pTiming, "fall_transition",     vTemples ) )
                        if ( !Scl_LibertyReadTable( p, vOut, pTiming, "rise_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }  
                }
                continue;
            }

            // write the timing tables
            Vec_PtrForEachEntry( char *, vNameIns, pName, i )
            {
                Vec_Ptr_t * vTables[4];
                Vec_Ptr_t * vTimings;
                vTimings = Scl_LibertyReadPinTimingAll( p, pPin, pName );
                Vec_StrPutS_( vOut, pName );
                Vec_StrPutI_( vOut, (int)(Vec_PtrSize(vTimings) != 0) );
                if ( Vec_PtrSize(vTimings) == 0 ) // output does not depend on input
                {
                    Vec_PtrFree( vTimings );
                    continue;
                }
                Vec_StrPutI_( vOut, Scl_LibertyReadTimingSense(p, (Scl_Item_t *)Vec_PtrEntry(vTimings, 0)) );
                Vec_StrPut_( vOut );
                Vec_StrPut_( vOut );
                // collect the timing tables
                for ( k = 0; k < 4; k++ )
                    vTables[k] = Vec_PtrAlloc( 16 );
                Vec_PtrForEachEntry( Scl_Item_t *, vTimings, pTiming, k )
                {
                    // some cells only have 'rise' or 'fall' but not both - here we work around this
                    if ( !Scl_LibertyScanTable( p, vTables[0], pTiming, "cell_rise",           vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[0], pTiming, "cell_fall",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[1], pTiming, "cell_fall",           vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[1], pTiming, "cell_rise",       vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[2], pTiming, "rise_transition",     vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[2], pTiming, "fall_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }                              
                    if ( !Scl_LibertyScanTable( p, vTables[3], pTiming, "fall_transition",     vTemples ) )
                        if ( !Scl_LibertyScanTable( p, vTables[3], pTiming, "rise_transition", vTemples ) )
                                { printf( "Table cannot be found\n" ); return NULL; }  
                }
                Vec_PtrFree( vTimings );
                // compute worse case of the tables
                for ( k = 0; k < 4; k++ )
                {
                    Vec_Flt_t * vInd0, * vInd1, * vValues;
                    if ( !Scl_LibertyComputeWorstCase( vTables[k], &vInd0, &vInd1, &vValues ) )
                        { printf( "Table indexes have different values\n" ); return NULL; }  
                    Vec_VecFree( (Vec_Vec_t *)vTables[k] );
                    Scl_LibertyDumpTables( vOut, vInd0, vInd1, vValues );
                    Vec_FltFree( vInd0 );
                    Vec_FltFree( vInd1 );
                    Vec_FltFree( vValues );
                }
            }
        }
        Vec_StrPut_( vOut );
        Vec_PtrFreeFree( vNameIns );
    }
    // free templates
    if ( vTemples )
    {
        Vec_Flt_t * vArray;
        assert( Vec_PtrSize(vTemples) % 4 == 0 );
        Vec_PtrForEachEntry( Vec_Flt_t *, vTemples, vArray, i )
        {
            if ( vArray == NULL )
                continue;
            if ( i % 4 == 0 )
                ABC_FREE( vArray );
            else if ( i % 4 == 2 || i % 4 == 3 )
                Vec_FltFree( vArray );
        }
        Vec_PtrFree( vTemples );
    }
    if ( fVerbose )
    {
        printf( "Library \"%s\" from \"%s\" has %d cells ", 
            Scl_LibertyReadString(p, Scl_LibertyRoot(p)->Head), p->pFileName, nCells );
        printf( "(%d skipped: %d seq; %d tri-state; %d no func; %d dont_use).  ", 
            nSkipped[0]+nSkipped[1]+nSkipped[2], nSkipped[0], nSkipped[1], nSkipped[2], nSkipped[3] );
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    }
    return vOut;
}